

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O0

void __thiscall
Occupy::calculate(Occupy *this,int peak_time_stamp,size_t peak_memory,uint64_t origin_time)

{
  int iVar1;
  bool bVar2;
  element_type *peVar3;
  __shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  reference this_01;
  reference pOVar4;
  element_type *peVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar14 [16];
  vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_> *local_d0;
  OperandUsage *usage_2;
  iterator __end1_3;
  iterator __begin1_3;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range1_3;
  OperandUsage *usage_1;
  iterator __end1_2;
  iterator __begin1_2;
  set<OperandUsage,_std::less<OperandUsage>,_std::allocator<OperandUsage>_> *__range1_2;
  longlong memory_increased;
  shared_ptr<Task> *task;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_> *__range1_1;
  uint64_t time_increased;
  OperandUsage *usage;
  iterator __end1;
  iterator __begin1;
  vector<OperandUsage,_std::allocator<OperandUsage>_> *__range1;
  uint64_t origin_time_local;
  size_t peak_memory_local;
  int peak_time_stamp_local;
  Occupy *this_local;
  undefined4 uVar8;
  undefined4 uVar12;
  undefined4 uVar13;
  
  this->move = true;
  peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)this);
  __end1 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&peVar3->outs);
  usage = (OperandUsage *)
          std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&peVar3->outs);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                                *)&usage);
    if (!bVar2) {
LAB_001aa3ea:
      if ((this->move & 1U) == 0) {
        peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            this);
        local_d0 = (vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_> *)
                   peVar3->duration;
      }
      else {
        local_d0 = (vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_> *)0x0;
      }
      __range1_1 = local_d0;
      __end1_1 = std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::begin
                           (&this->re_gen);
      task = (shared_ptr<Task> *)
             std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>::end
                       (&this->re_gen);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<std::shared_ptr<Task>_*,_std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>_>
                                 *)&task), bVar2) {
        this_00 = (__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                  __gnu_cxx::
                  __normal_iterator<std::shared_ptr<Task>_*,_std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>_>
                  ::operator*(&__end1_1);
        peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_00);
        __range1_1 = (vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_> *)
                     ((long)&(__range1_1->
                             super__Vector_base<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + peVar3->duration);
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Task>_*,_std::vector<std::shared_ptr<Task>,_std::allocator<std::shared_ptr<Task>_>_>_>
        ::operator++(&__end1_1);
      }
      __range1_2 = (set<OperandUsage,_std::less<OperandUsage>,_std::allocator<OperandUsage>_> *)0x0;
      __end1_2 = std::set<OperandUsage,_std::less<OperandUsage>,_std::allocator<OperandUsage>_>::
                 begin(&this->re_gen_ins);
      usage_1 = (OperandUsage *)
                std::set<OperandUsage,_std::less<OperandUsage>,_std::allocator<OperandUsage>_>::end
                          (&this->re_gen_ins);
      while (bVar2 = std::operator!=(&__end1_2,(_Self *)&usage_1), bVar2) {
        this_01 = std::_Rb_tree_const_iterator<OperandUsage>::operator*(&__end1_2);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this_01->last_use);
        if ((!bVar2) ||
           (peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&this_01->last_use), peVar3->time_stamp < peak_time_stamp)) {
          peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                              )this);
          bVar2 = Task::contains(peVar3,&this_01->operand,true);
          if (!bVar2) {
            peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this_01);
            __range1_2 = (set<OperandUsage,_std::less<OperandUsage>,_std::allocator<OperandUsage>_>
                          *)(&(__range1_2->_M_t)._M_impl.field_0x0 + peVar5->size);
          }
        }
        std::_Rb_tree_const_iterator<OperandUsage>::operator++(&__end1_2);
      }
      peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->use);
      __end1_3 = std::vector<OperandUsage,_std::allocator<OperandUsage>_>::begin(&peVar3->ins);
      usage_2 = (OperandUsage *)
                std::vector<OperandUsage,_std::allocator<OperandUsage>_>::end(&peVar3->ins);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_3,
                                (__normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                                 *)&usage_2), bVar2) {
        pOVar4 = __gnu_cxx::
                 __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
                 ::operator*(&__end1_3);
        peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            this);
        bVar2 = Task::contains(peVar3,&pOVar4->operand,true);
        if ((bVar2) &&
           ((bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pOVar4->prev_use),
            !bVar2 || (peVar3 = std::
                                __shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)&pOVar4->prev_use),
                      peVar3->time_stamp < peak_time_stamp)))) {
          peVar5 = std::__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Operand,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)pOVar4);
          __range1_2 = (set<OperandUsage,_std::less<OperandUsage>,_std::allocator<OperandUsage>_> *)
                       ((long)__range1_2 - peVar5->size);
        }
        __gnu_cxx::
        __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
        ::operator++(&__end1_3);
      }
      uVar12 = (undefined4)(peak_memory >> 0x20);
      auVar9._8_4_ = uVar12;
      auVar9._0_8_ = peak_memory;
      auVar9._12_4_ = 0x45300000;
      this->score1 = ((double)(long)__range1_2 /
                     ((auVar9._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)peak_memory) - 4503599627370496.0))) * 0.2;
      uVar8 = (undefined4)((ulong)__range1_1 >> 0x20);
      auVar6._8_4_ = uVar8;
      auVar6._0_8_ = __range1_1;
      auVar6._12_4_ = 0x45300000;
      uVar13 = (undefined4)(origin_time >> 0x20);
      auVar10._8_4_ = uVar13;
      auVar10._0_8_ = origin_time;
      auVar10._12_4_ = 0x45300000;
      this->score1 = (((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)__range1_1) - 4503599627370496.0)) /
                     ((auVar10._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)origin_time) - 4503599627370496.0))) * 0.8 +
                     this->score1;
      auVar14._8_4_ = uVar12;
      auVar14._0_8_ = peak_memory;
      auVar14._12_4_ = 0x45300000;
      this->score2 = ((double)(long)__range1_2 /
                     ((auVar14._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)peak_memory) - 4503599627370496.0))) * 0.8;
      auVar7._8_4_ = uVar8;
      auVar7._0_8_ = __range1_1;
      auVar7._12_4_ = 0x45300000;
      auVar11._8_4_ = uVar13;
      auVar11._0_8_ = origin_time;
      auVar11._12_4_ = 0x45300000;
      this->score2 = (((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)__range1_1) - 4503599627370496.0)) /
                     ((auVar11._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)origin_time) - 4503599627370496.0))) *
                     0.19999999999999996 + this->score2;
      return;
    }
    pOVar4 = __gnu_cxx::
             __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>
             ::operator*(&__end1);
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&pOVar4->next_use);
    if (bVar2) {
      peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &pOVar4->next_use);
      iVar1 = peVar3->time_stamp;
      peVar3 = std::__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Task,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &this->use);
      if (iVar1 < peVar3->time_stamp) {
        this->move = false;
        goto LAB_001aa3ea;
      }
    }
    __gnu_cxx::
    __normal_iterator<OperandUsage_*,_std::vector<OperandUsage,_std::allocator<OperandUsage>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

void calculate(int peak_time_stamp, size_t peak_memory, uint64_t origin_time) {
        // Maybe dead code
        move = true;
        for (auto &usage: gen->outs) {
            if (usage.next_use and usage.next_use->time_stamp < use->time_stamp) {
                move = false;
                break;
            }
        }

        // Time increased
        uint64_t time_increased = move ? 0 : gen->duration;
        for (auto &task: re_gen) {
            time_increased += task->duration;
        }

        // Memory increased
        // Use `signed long long` instead of `size_t`
        long long memory_increased = 0;
        // Prolong dealloc time (memory increased)
        for (auto &usage: re_gen_ins) {
            if ((not usage.last_use or usage.last_use->time_stamp < peak_time_stamp) and (not gen->contains(usage.operand))) {
                memory_increased += usage.operand->size;
            }
        }
        // Re-computation (memory decreased)
        for (auto &usage: use->ins) {
            if (gen->contains(usage.operand) and (not usage.prev_use or usage.prev_use->time_stamp < peak_time_stamp)) {
                memory_increased -= usage.operand->size;
            }
        }

        // Calculate score, lower is better
        score1 = static_cast<double>(memory_increased) / peak_memory * O1_MEMORY_FACTOR;
        score1 += static_cast<double>(time_increased) / origin_time * O1_TIME_FACTOR;
        score2 = static_cast<double>(memory_increased) / peak_memory * O2_MEMORY_FACTOR;
        score2 += static_cast<double>(time_increased) / origin_time * O2_TIME_FACTOR;
    }